

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O1

void __thiscall Encode::Encode(Encode *this,List *list)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  short sVar2;
  Node **ppNVar3;
  iterator iVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  anon_union_64_2_a4b029fc_for_Node_1 *__args;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  char *j;
  long lVar11;
  string tmpStr;
  string __str;
  char *local_80;
  long local_78;
  char local_70;
  undefined7 uStack_6f;
  long *local_60 [2];
  long local_50 [2];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  long local_38;
  
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = (long)list->m_listSize;
  if (0 < local_38) {
    local_40 = &this->m_matrix;
    this_00 = &this->m_data;
    ppNVar3 = list->m_indexArray;
    lVar9 = 0;
    do {
      local_80 = &local_70;
      local_78 = 0;
      local_70 = '\0';
      cVar6 = (ppNVar3[lVar9]->field_1).data.author[0];
      if (cVar6 != '\0') {
        __args = &ppNVar3[lVar9]->field_1;
        lVar11 = 9;
        do {
          iVar4._M_current =
               (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar4,(char *)__args->Digit);
          }
          else {
            *iVar4._M_current = cVar6;
            ppcVar1 = &(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          cVar6 = *(char *)((long)&ppNVar3[lVar9]->next + lVar11);
          __args = (anon_union_64_2_a4b029fc_for_Node_1 *)((long)&ppNVar3[lVar9]->next + lVar11);
          lVar11 = lVar11 + 1;
        } while (cVar6 != '\0');
      }
      cVar6 = (ppNVar3[lVar9]->field_1).data.title[0];
      if (cVar6 != '\0') {
        pcVar8 = (ppNVar3[lVar9]->field_1).data.title;
        lVar11 = 0x15;
        do {
          iVar4._M_current =
               (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar8);
          }
          else {
            *iVar4._M_current = cVar6;
            ppcVar1 = &(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          cVar6 = *(char *)((long)&ppNVar3[lVar9]->next + lVar11);
          pcVar8 = (char *)((long)&ppNVar3[lVar9]->next + lVar11);
          lVar11 = lVar11 + 1;
        } while (cVar6 != '\0');
      }
      cVar6 = (ppNVar3[lVar9]->field_1).data.publishingHouse[0];
      if (cVar6 != '\0') {
        pcVar8 = (ppNVar3[lVar9]->field_1).data.publishingHouse;
        lVar11 = 0x35;
        do {
          iVar4._M_current =
               (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar8);
          }
          else {
            *iVar4._M_current = cVar6;
            ppcVar1 = &(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          cVar6 = *(char *)((long)&ppNVar3[lVar9]->next + lVar11);
          pcVar8 = (char *)((long)&ppNVar3[lVar9]->next + lVar11);
          lVar11 = lVar11 + 1;
        } while (cVar6 != '\0');
      }
      sVar2 = (ppNVar3[lVar9]->field_1).data.year;
      uVar10 = (uint)sVar2;
      uVar5 = -uVar10;
      if (0 < (int)uVar10) {
        uVar5 = uVar10;
      }
      uVar7 = 1;
      if (((9 < uVar5) && (uVar7 = 2, 99 < uVar5)) && (uVar7 = 3, 999 < uVar5)) {
        uVar7 = 5 - (uVar5 < 10000);
      }
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct((ulong)local_60,(char)uVar7 - (char)(sVar2 >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_60[0]),uVar7,uVar5);
      std::__cxx11::string::operator=((string *)&local_80,(string *)local_60);
      pcVar8 = local_80;
      lVar11 = local_78;
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
        pcVar8 = local_80;
        lVar11 = local_78;
      }
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        iVar4._M_current =
             (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar8);
        }
        else {
          *iVar4._M_current = *pcVar8;
          ppcVar1 = &(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        pcVar8 = pcVar8 + 1;
      }
      sVar2 = (ppNVar3[lVar9]->field_1).data.qtyPages;
      uVar10 = (uint)sVar2;
      uVar5 = -uVar10;
      if (0 < (int)uVar10) {
        uVar5 = uVar10;
      }
      uVar7 = 1;
      if (((9 < uVar5) && (uVar7 = 2, 99 < uVar5)) && (uVar7 = 3, 999 < uVar5)) {
        uVar7 = 5 - (uVar5 < 10000);
      }
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct((ulong)local_60,(char)uVar7 - (char)(sVar2 >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_60[0]),uVar7,uVar5);
      std::__cxx11::string::operator=((string *)&local_80,(string *)local_60);
      pcVar8 = local_80;
      lVar11 = local_78;
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
        pcVar8 = local_80;
        lVar11 = local_78;
      }
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        iVar4._M_current =
             (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar8);
        }
        else {
          *iVar4._M_current = *pcVar8;
          ppcVar1 = &(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        pcVar8 = pcVar8 + 1;
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != local_38);
  }
  return;
}

Assistant:

explicit Encode(List &list) {
        Node **listIndexArr = list.getIndexArray();
        int listSize = list.getIndexArraySize();
        for (int i = 0; i < listSize; ++i) {
            string tmpStr;
            for (int j = 0; listIndexArr[i]->data.author[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.author[j]);
            }
            for (int j = 0; listIndexArr[i]->data.title[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.title[j]);
            }
            for (int j = 0; listIndexArr[i]->data.publishingHouse[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.publishingHouse[j]);
            }
            tmpStr = to_string(listIndexArr[i]->data.year);
            for (auto &j : tmpStr) {
                m_data.push_back(j);
            }
            tmpStr = to_string(listIndexArr[i]->data.qtyPages);
            for (auto &j : tmpStr) {
                m_data.push_back(j);
            }
        }
    }